

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O1

EdgeIterator * __thiscall dg::vr::Bucket::EdgeIterator::operator++(EdgeIterator *this)

{
  iterator __position;
  pointer *ppDVar1;
  pointer pDVar2;
  Bucket *__args;
  reference_wrapper<dg::vr::Bucket> *prVar3;
  DirectRelIterator current;
  DirectRelIterator local_48;
  
  pDVar2 = (this->stack).
           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __position._M_current = pDVar2 + -1;
  __args = pDVar2[-1].current._to._M_data;
  local_48.relationIt = pDVar2[-1].relationIt;
  prVar3 = pDVar2[-1].bucketIt._M_current;
  local_48.current._from._M_data = pDVar2[-1].current._from._M_data;
  local_48.current._rel = pDVar2[-1].current._rel;
  local_48.current._12_4_ = *(undefined4 *)&pDVar2[-1].current.field_0xc;
  (this->stack).
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
  local_48.bucketIt._M_current = prVar3 + 1;
  local_48.current._to._M_data = __args;
  if (__position._M_current ==
      (this->stack).
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
    ::_M_realloc_insert<dg::vr::Bucket::DirectRelIterator&>
              ((vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
                *)&this->stack,__position,&local_48);
  }
  else {
    pDVar2[-1].current._to._M_data = __args;
    pDVar2[-1].current._from._M_data = local_48.current._from._M_data;
    pDVar2[-1].current._rel = local_48.current._rel;
    *(undefined4 *)&pDVar2[-1].current.field_0xc = local_48.current._12_4_;
    (__position._M_current)->relationIt = local_48.relationIt;
    pDVar2[-1].bucketIt._M_current = local_48.bucketIt._M_current;
    ppDVar1 = &(this->stack).
               super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
  std::vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>::
  emplace_back<dg::vr::Bucket_const&>
            ((vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
              *)&this->stack,__args);
  nextViableEdge(this);
  return this;
}

Assistant:

EdgeIterator &operator++() {
            DirectRelIterator current = stack.back();
            stack.pop_back();

            const Bucket &to = current->to();

            // plan return to next successor of "from" bucket
            current.inc(); // dont use ++, because incoming relation is needed
                           // on the stack
            stack.emplace_back(current);

            // plan visit to first successor of "to" bucket if unexplored so far
            stack.emplace_back(to);
            nextViableEdge();

            return *this;
        }